

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

ssl_ticket_aead_result_t
bssl::ssl_process_ticket
          (SSL_HANDSHAKE *hs,UniquePtr<SSL_SESSION> *out_session,bool *out_renew_ticket,
          Span<const_unsigned_char> ticket,Span<const_unsigned_char> session_id)

{
  SSL *ssl;
  SSL_HANDSHAKE_HINTS *pSVar1;
  ssl_ctx_st *psVar2;
  _Head_base<0UL,_ssl_ctx_st_*,_false> ctx;
  _Head_base<0UL,_bssl::TicketKey_*,_false> _Var3;
  TicketKey *pTVar4;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  HMAC_CTX *d;
  UniquePtr<SSL_SESSION> __p;
  bool bVar5;
  uint16_t uVar6;
  uint32_t uVar7;
  int iVar8;
  uint uVar9;
  EVP_CIPHER *cipher;
  UniquePtr<bssl::TicketKey> *pUVar10;
  EVP_MD *md;
  uchar *new_size;
  size_t in_R9;
  size_t sVar11;
  ssl_ticket_aead_result_t sVar12;
  Span<const_unsigned_char> ticket_00;
  Span<const_unsigned_char> in_01;
  Span<const_unsigned_char> SVar13;
  Span<const_unsigned_char> SVar14;
  Array<unsigned_char> plaintext;
  Span<const_unsigned_char> local_178;
  HMAC_CTX *local_168;
  size_t local_160;
  uchar *local_158;
  MutexLockBase<&CRYPTO_MUTEX_lock_read,_&CRYPTO_MUTEX_unlock_read> local_150;
  EVP_CIPHER *local_148;
  uchar *local_140;
  UniquePtr<SSL_SESSION> session;
  ScopedHMAC_CTX hmac_ctx;
  
  new_size = (uchar *)ticket.size_;
  ssl = hs->ssl;
  *out_renew_ticket = false;
  std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)out_session,(pointer)0x0);
  uVar7 = SSL_get_options(hs->ssl);
  if ((uVar7 >> 0xe & 1) != 0) {
    return ssl_ticket_aead_ignore_ticket;
  }
  if (0x20 < session_id.size_) {
    return ssl_ticket_aead_ignore_ticket;
  }
  local_168 = (HMAC_CTX *)ticket.data_;
  uVar6 = ssl_protocol_version(ssl);
  plaintext.data_ = (uchar *)0x0;
  plaintext.size_ = 0;
  pSVar1 = (hs->hints)._M_t.
           super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>._M_head_impl;
  if (pSVar1 == (SSL_HANDSHAKE_HINTS *)0x0 || uVar6 < 0x304) {
    if ((uVar6 < 0x304 && pSVar1 != (SSL_HANDSHAKE_HINTS *)0x0) && ((hs->field_0x6ca & 0x10) == 0))
    {
      sVar11 = (pSVar1->decrypted_ticket).size_;
      if (sVar11 != 0) {
        SVar13.size_ = sVar11;
        SVar13.data_ = (pSVar1->decrypted_ticket).data_;
        bVar5 = Array<unsigned_char>::CopyFrom(&plaintext,SVar13);
        if (bVar5) {
          *out_renew_ticket = pSVar1->renew_ticket;
          sVar12 = ssl_ticket_aead_success;
        }
        else {
          sVar12 = ssl_ticket_aead_error;
        }
        goto LAB_00134bd1;
      }
      if (pSVar1->ignore_ticket != false) goto LAB_00134976;
    }
LAB_00134986:
    psVar2 = (ssl->session_ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t
             .super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
    if (psVar2->ticket_aead_method == (SSL_TICKET_AEAD_METHOD *)0x0) {
      if (new_size < (uchar *)0x20) {
        sVar12 = ssl_ticket_aead_ignore_ticket;
      }
      else {
        local_178.size_ = (size_t)new_size;
        if (psVar2->ticket_key_cb ==
            (_func_int_SSL_ptr_uint8_t_ptr_uint8_t_ptr_EVP_CIPHER_CTX_ptr_HMAC_CTX_ptr_int *)0x0) {
          local_178.data_ = (uchar *)local_168;
          ctx._M_head_impl =
               (hs->ssl->session_ctx)._M_t.
               super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
          bVar5 = ssl_ctx_rotate_ticket_encryption_key(ctx._M_head_impl);
          if (!bVar5) {
            sVar12 = ssl_ticket_aead_error;
            goto LAB_00134a21;
          }
          cipher = EVP_aes_128_cbc();
          SVar13 = Span<const_unsigned_char>::subspan(&local_178,0,0x10);
          local_160 = SVar13.size_;
          local_158 = SVar13.data_;
          uVar9 = EVP_CIPHER_iv_length(cipher);
          SVar13 = Span<const_unsigned_char>::subspan(&local_178,0x10,(ulong)uVar9);
          local_140 = SVar13.data_;
          EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)&session);
          HMAC_CTX_init((HMAC_CTX *)&hmac_ctx);
          local_150.mu_ = &(ctx._M_head_impl)->lock;
          local_148 = cipher;
          CRYPTO_MUTEX_lock_read(local_150.mu_);
          _Var3._M_head_impl =
               ((ctx._M_head_impl)->ticket_key_current)._M_t.
               super___uniq_ptr_impl<bssl::TicketKey,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bssl::TicketKey_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::TicketKey_*,_false>._M_head_impl;
          if ((_Var3._M_head_impl == (TicketKey *)0x0) ||
             (bVar5 = std::__equal4<unsigned_char_const*,unsigned_char_const*>
                                (local_158,local_158 + local_160,(_Var3._M_head_impl)->name,
                                 (_Var3._M_head_impl)->hmac_key), !bVar5)) {
            _Var3._M_head_impl =
                 ((ctx._M_head_impl)->ticket_key_prev)._M_t.
                 super___uniq_ptr_impl<bssl::TicketKey,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_bssl::TicketKey_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bssl::TicketKey_*,_false>._M_head_impl;
            sVar12 = ssl_ticket_aead_ignore_ticket;
            if ((_Var3._M_head_impl != (TicketKey *)0x0) &&
               (bVar5 = std::__equal4<unsigned_char_const*,unsigned_char_const*>
                                  (local_158,local_158 + local_160,(_Var3._M_head_impl)->name,
                                   (_Var3._M_head_impl)->hmac_key), bVar5)) {
              pUVar10 = &(ctx._M_head_impl)->ticket_key_prev;
              goto LAB_00134d40;
            }
LAB_00134d92:
            bVar5 = false;
          }
          else {
            pUVar10 = &(ctx._M_head_impl)->ticket_key_current;
LAB_00134d40:
            pTVar4 = (pUVar10->_M_t).super___uniq_ptr_impl<bssl::TicketKey,_bssl::internal::Deleter>
                     ._M_t.super__Tuple_impl<0UL,_bssl::TicketKey_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bssl::TicketKey_*,_false>._M_head_impl;
            md = EVP_sha256();
            iVar8 = HMAC_Init_ex((HMAC_CTX *)&hmac_ctx,pTVar4->hmac_key,0x10,md,(ENGINE *)0x0);
            sVar12 = ssl_ticket_aead_error;
            if (iVar8 == 0) goto LAB_00134d92;
            iVar8 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)&session,local_148,(ENGINE *)0x0,
                                       pTVar4->aes_key,local_140);
            bVar5 = iVar8 != 0;
          }
          internal::MutexLockBase<&CRYPTO_MUTEX_lock_read,_&CRYPTO_MUTEX_unlock_read>::
          ~MutexLockBase(&local_150);
          if (bVar5) {
            SVar14.size_ = in_R9;
            SVar14.data_ = (uchar *)local_178.size_;
            sVar12 = decrypt_ticket_with_cipher_ctx
                               ((bssl *)&plaintext,(Array<unsigned_char> *)&session,
                                (EVP_CIPHER_CTX *)&hmac_ctx,(HMAC_CTX *)local_178.data_,SVar14);
          }
        }
        else {
          local_178.data_ = (uchar *)local_168;
          EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)&session);
          HMAC_CTX_init((HMAC_CTX *)&hmac_ctx);
          SVar13 = Span<const_unsigned_char>::subspan(&local_178,0,0x10);
          SVar14 = Span<const_unsigned_char>::subspan(&local_178,0x10,0x10);
          sVar11 = 0;
          iVar8 = (*((hs->ssl->session_ctx)._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->ticket_key_cb)
                            (hs->ssl,SVar13.data_,SVar14.data_,(EVP_CIPHER_CTX *)&session,
                             &hmac_ctx.ctx_,0);
          if (iVar8 < 0) {
            sVar12 = ssl_ticket_aead_error;
          }
          else if (iVar8 == 0) {
            sVar12 = ssl_ticket_aead_ignore_ticket;
          }
          else {
            if (iVar8 != 1) {
              if (iVar8 != 2) {
                __assert_fail("cb_ret == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                              ,0x10e2,
                              "enum ssl_ticket_aead_result_t bssl::ssl_decrypt_ticket_with_cb(SSL_HANDSHAKE *, Array<uint8_t> *, bool *, Span<const uint8_t>)"
                             );
              }
              *out_renew_ticket = true;
            }
            ticket_00.size_ = sVar11;
            ticket_00.data_ = (uchar *)local_178.size_;
            sVar12 = decrypt_ticket_with_cipher_ctx
                               ((bssl *)&plaintext,(Array<unsigned_char> *)&session,
                                (EVP_CIPHER_CTX *)&hmac_ctx,(HMAC_CTX *)local_178.data_,ticket_00);
          }
        }
        internal::StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>::
        ~StackAllocated(&hmac_ctx);
        internal::
        StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>::
        ~StackAllocated((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                         *)&session);
      }
    }
    else {
      session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
      bVar5 = Array<unsigned_char>::InitUninitialized
                        ((Array<unsigned_char> *)&session,(size_t)new_size);
      if (bVar5) {
        sVar12 = (*((hs->ssl->session_ctx)._M_t.
                    super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->ticket_aead_method->
                   open)(hs->ssl,(uint8_t *)
                                 session._M_t.
                                 super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t
                                 .super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                         (size_t *)&hmac_ctx,(size_t)new_size,(uint8_t *)local_168,(size_t)new_size)
        ;
        if (sVar12 == ssl_ticket_aead_success) {
          if (hmac_ctx.ctx_.md != (EVP_MD *)0x0) {
            abort();
          }
          Array<unsigned_char>::operator=(&plaintext,(Array<unsigned_char> *)&session);
        }
      }
      else {
        sVar12 = ssl_ticket_aead_error;
      }
      Array<unsigned_char>::~Array((Array<unsigned_char> *)&session);
    }
LAB_00134a21:
    if (pSVar1 != (SSL_HANDSHAKE_HINTS *)0x0) goto LAB_00134bd1;
LAB_00134bdb:
    if (sVar12 != ssl_ticket_aead_success) goto LAB_00134cd3;
  }
  else {
    if ((hs->field_0x6ca & 0x10) != 0) goto LAB_00134986;
    sVar11 = (pSVar1->decrypted_psk).size_;
    if (sVar11 == 0) {
      if (pSVar1->ignore_psk == false) goto LAB_00134986;
LAB_00134976:
      sVar12 = ssl_ticket_aead_ignore_ticket;
    }
    else {
      in_01.size_ = sVar11;
      in_01.data_ = (pSVar1->decrypted_psk).data_;
      bVar5 = Array<unsigned_char>::CopyFrom(&plaintext,in_01);
      sVar12 = (uint)!bVar5 + (uint)!bVar5 * 2;
    }
LAB_00134bd1:
    if ((hs->field_0x6ca & 0x10) == 0) goto LAB_00134bdb;
    if (sVar12 != ssl_ticket_aead_success) {
      if (sVar12 == ssl_ticket_aead_ignore_ticket) {
        if (uVar6 < 0x304) {
          pSVar1->ignore_ticket = true;
        }
        else {
          pSVar1->ignore_psk = true;
        }
        sVar12 = ssl_ticket_aead_ignore_ticket;
      }
      goto LAB_00134cd3;
    }
    in_00.size_ = plaintext.size_;
    in_00.data_ = plaintext.data_;
    in.size_ = plaintext.size_;
    in.data_ = plaintext.data_;
    if (uVar6 < 0x304) {
      bVar5 = Array<unsigned_char>::CopyFrom(&pSVar1->decrypted_ticket,in_00);
      if (!bVar5) goto LAB_00134ccf;
      pSVar1->renew_ticket = *out_renew_ticket;
    }
    else {
      bVar5 = Array<unsigned_char>::CopyFrom(&pSVar1->decrypted_psk,in);
      if (!bVar5) {
LAB_00134ccf:
        sVar12 = ssl_ticket_aead_error;
        goto LAB_00134cd3;
      }
    }
  }
  session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
       SSL_SESSION_from_bytes
                 (plaintext.data_,plaintext.size_,
                  (ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
  d = local_168;
  if ((tuple<ssl_session_st_*,_bssl::internal::Deleter>)
      session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ssl_session_st_*,_false>)0x0) {
    ERR_clear_error();
    sVar12 = ssl_ticket_aead_ignore_ticket;
  }
  else {
    InplaceVector<unsigned_char,_32UL>::ResizeForOverwrite
              ((InplaceVector<unsigned_char,_32UL> *)
               ((long)session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                      _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x4b),0x20);
    SHA256((uchar *)d,(size_t)new_size,
           (uchar *)((long)session._M_t.
                           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x4b));
    __p = session;
    session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
    std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)out_session,
               (pointer)__p._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t
                        .super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
    sVar12 = ssl_ticket_aead_success;
  }
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&session);
LAB_00134cd3:
  Array<unsigned_char>::~Array(&plaintext);
  return sVar12;
}

Assistant:

enum ssl_ticket_aead_result_t ssl_process_ticket(
    SSL_HANDSHAKE *hs, UniquePtr<SSL_SESSION> *out_session,
    bool *out_renew_ticket, Span<const uint8_t> ticket,
    Span<const uint8_t> session_id) {
  SSL *const ssl = hs->ssl;
  *out_renew_ticket = false;
  out_session->reset();

  if ((SSL_get_options(hs->ssl) & SSL_OP_NO_TICKET) ||
      session_id.size() > SSL_MAX_SSL_SESSION_ID_LENGTH) {
    return ssl_ticket_aead_ignore_ticket;
  }

  // Tickets in TLS 1.3 are tied into pre-shared keys (PSKs), unlike in TLS 1.2
  // where that concept doesn't exist. The |decrypted_psk| and |ignore_psk|
  // hints only apply to PSKs. We check the version to determine which this is.
  const bool is_psk = ssl_protocol_version(ssl) >= TLS1_3_VERSION;

  Array<uint8_t> plaintext;
  enum ssl_ticket_aead_result_t result;
  SSL_HANDSHAKE_HINTS *const hints = hs->hints.get();
  if (is_psk && hints && !hs->hints_requested &&
      !hints->decrypted_psk.empty()) {
    result = plaintext.CopyFrom(hints->decrypted_psk) ? ssl_ticket_aead_success
                                                      : ssl_ticket_aead_error;
  } else if (is_psk && hints && !hs->hints_requested && hints->ignore_psk) {
    result = ssl_ticket_aead_ignore_ticket;
  } else if (!is_psk && hints && !hs->hints_requested &&
             !hints->decrypted_ticket.empty()) {
    if (plaintext.CopyFrom(hints->decrypted_ticket)) {
      result = ssl_ticket_aead_success;
      *out_renew_ticket = hints->renew_ticket;
    } else {
      result = ssl_ticket_aead_error;
    }
  } else if (!is_psk && hints && !hs->hints_requested && hints->ignore_ticket) {
    result = ssl_ticket_aead_ignore_ticket;
  } else if (ssl->session_ctx->ticket_aead_method != NULL) {
    result = ssl_decrypt_ticket_with_method(hs, &plaintext, out_renew_ticket,
                                            ticket);
  } else {
    // Ensure there is room for the key name and the largest IV |ticket_key_cb|
    // may try to consume. The real limit may be lower, but the maximum IV
    // length should be well under the minimum size for the session material and
    // HMAC.
    if (ticket.size() < SSL_TICKET_KEY_NAME_LEN + EVP_MAX_IV_LENGTH) {
      result = ssl_ticket_aead_ignore_ticket;
    } else if (ssl->session_ctx->ticket_key_cb != NULL) {
      result =
          ssl_decrypt_ticket_with_cb(hs, &plaintext, out_renew_ticket, ticket);
    } else {
      result = ssl_decrypt_ticket_with_ticket_keys(hs, &plaintext, ticket);
    }
  }

  if (hints && hs->hints_requested) {
    if (result == ssl_ticket_aead_ignore_ticket) {
      if (is_psk) {
        hints->ignore_psk = true;
      } else {
        hints->ignore_ticket = true;
      }
    } else if (result == ssl_ticket_aead_success) {
      if (is_psk) {
        if (!hints->decrypted_psk.CopyFrom(plaintext)) {
          return ssl_ticket_aead_error;
        }
      } else {
        if (!hints->decrypted_ticket.CopyFrom(plaintext)) {
          return ssl_ticket_aead_error;
        }
        hints->renew_ticket = *out_renew_ticket;
      }
    }
  }

  if (result != ssl_ticket_aead_success) {
    return result;
  }

  // Decode the session.
  UniquePtr<SSL_SESSION> session(SSL_SESSION_from_bytes(
      plaintext.data(), plaintext.size(), ssl->ctx.get()));
  if (!session) {
    ERR_clear_error();  // Don't leave an error on the queue.
    return ssl_ticket_aead_ignore_ticket;
  }

  // Envoy's tests expect the session to have a session ID that matches the
  // placeholder used by the client. It's unclear whether this is a good idea,
  // but we maintain it for now.
  session->session_id.ResizeForOverwrite(SHA256_DIGEST_LENGTH);
  SHA256(ticket.data(), ticket.size(), session->session_id.data());

  *out_session = std::move(session);
  return ssl_ticket_aead_success;
}